

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void pick_sb_modes_nonrd(AV1_COMP *cpi,TileDataEnc *tile_data,MACROBLOCK *x,int mi_row,int mi_col,
                        RD_STATS *rd_cost,BLOCK_SIZE bsize,PICK_MODE_CONTEXT *ctx)

{
  undefined4 uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long *plVar8;
  int in_ECX;
  long in_RDX;
  long in_RDI;
  int in_R8D;
  undefined4 *in_R9;
  MACROBLOCK *unaff_retaddr;
  byte in_stack_00000008;
  undefined7 in_stack_00000009;
  long in_stack_00000010;
  uint thresh_spatial_var;
  int is_720p_or_larger;
  MB_MODE_INFO **mi_sb;
  int mi_col_sb;
  int mi_row_sb;
  int allow_cdef_skipping;
  int orig_rdmult;
  int seg_skip;
  int i;
  TxfmSearchInfo *txfm_info;
  AQ_MODE aq_mode;
  macroblockd_plane *pd;
  macroblock_plane *p;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int num_planes;
  AV1_COMMON *cm;
  PICK_MODE_CONTEXT *in_stack_0000d008;
  BLOCK_SIZE in_stack_0000d017;
  RD_STATS *in_stack_0000d018;
  MACROBLOCK *in_stack_0000d020;
  TileDataEnc *in_stack_0000d028;
  AV1_COMP *in_stack_0000d030;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 uVar9;
  undefined4 in_stack_ffffffffffffff44;
  undefined6 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  undefined1 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff51;
  undefined1 in_stack_ffffffffffffff52;
  undefined4 in_stack_ffffffffffffff53;
  BLOCK_SIZE in_stack_ffffffffffffff57;
  undefined1 uVar10;
  int in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  BLOCK_SIZE bsize_00;
  RD_STATS *in_stack_ffffffffffffff60;
  long lVar11;
  undefined5 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6d;
  bool bVar12;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  byte bVar13;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined8 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 uVar14;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar15;
  long lVar16;
  
  uVar14 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  if ((in_stack_00000008 != *(byte *)(*(long *)(in_RDI + 0x42008) + 0x1c)) ||
     (*(int *)(in_RDI + 0x60ca4) == 1)) {
    av1_set_offsets((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (TileInfo *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                    (MACROBLOCK *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78,
                    (BLOCK_SIZE)((uint)in_stack_ffffffffffffff74 >> 0x18));
  }
  lVar16 = in_RDI;
  iVar3 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
  lVar2 = **(long **)(in_RDX + 0x2058);
  iVar4 = segfeature_active((segmentation *)(in_RDI + 0x409b8),
                            (byte)*(undefined2 *)(lVar2 + 0xa7) & 7,'\x06');
  uVar9 = CONCAT44(uVar14,in_ECX);
  iVar6 = in_R8D;
  wait_for_top_right_sb
            ((AV1EncRowMultiThreadInfo *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (AV1EncRowMultiThreadSync *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,in_stack_ffffffffffffff68))),
             (TileInfo *)in_stack_ffffffffffffff60,
             (BLOCK_SIZE)((uint)in_stack_ffffffffffffff5c >> 0x18),in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff57,in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
  *(long *)(in_RDX + 0x2088) = in_RDX + 0x25209;
  *(uint *)(in_RDX + 0x2090) =
       (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [in_stack_00000008];
  for (iVar15 = 0; iVar15 < iVar3; iVar15 = iVar15 + 1) {
    *(undefined8 *)(in_RDX + (long)iVar15 * 0x88 + 0x18) =
         *(undefined8 *)(in_stack_00000010 + 0x120 + (long)iVar15 * 8);
    *(undefined8 *)(in_RDX + (long)iVar15 * 0x88 + 0x10) =
         *(undefined8 *)(in_stack_00000010 + 0x138 + (long)iVar15 * 8);
    *(undefined8 *)(in_RDX + (long)iVar15 * 0x88 + 8) =
         *(undefined8 *)(in_stack_00000010 + 0x150 + (long)iVar15 * 8);
    *(undefined8 *)(in_RDX + (long)iVar15 * 0x88 + 0x20) =
         *(undefined8 *)(in_stack_00000010 + 0x168 + (long)iVar15 * 8);
    *(undefined8 *)(in_RDX + (long)iVar15 * 0x88 + 0x28) =
         *(undefined8 *)(in_stack_00000010 + 0x180 + (long)iVar15 * 8);
  }
  for (iVar3 = 0; iVar3 < 2; iVar3 = iVar3 + 1) {
    *(undefined8 *)(in_RDX + (long)iVar3 * 0xa30 + 0x250) =
         *(undefined8 *)(in_stack_00000010 + 0x108 + (long)iVar3 * 8);
  }
  if (iVar4 == 0) {
    iVar3 = get_force_zeromv_skip_flag_for_blk
                      ((AV1_COMP *)CONCAT71(in_stack_00000009,in_stack_00000008),unaff_retaddr,
                       (BLOCK_SIZE)((ulong)lVar16 >> 0x38));
    *(int *)(in_RDX + 0x15244) = iVar3;
    if ((*(int *)(in_RDX + 0x15244) == 0) &&
       ((*(int *)(in_RDX + 0x25640) == -1 ||
        (in_stack_00000008 < *(byte *)(*(long *)(in_RDI + 0x42008) + 0x1c))))) {
      uVar5 = av1_get_perpixel_variance_facade
                        ((AV1_COMP *)
                         CONCAT17(in_stack_ffffffffffffff57,
                                  CONCAT43(in_stack_ffffffffffffff53,
                                           CONCAT12(in_stack_ffffffffffffff52,
                                                    CONCAT11(in_stack_ffffffffffffff51,
                                                             in_stack_ffffffffffffff50)))),
                         (MACROBLOCKD *)
                         CONCAT17(in_stack_ffffffffffffff4f,
                                  CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)),
                         (buf_2d *)CONCAT44(in_stack_ffffffffffffff44,iVar6),
                         (BLOCK_SIZE)((ulong)uVar9 >> 0x38),(int)uVar9);
      *(uint *)(in_RDX + 0x25640) = uVar5;
    }
  }
  uVar14 = *(undefined4 *)(in_RDX + 0x4218);
  setup_block_rdmult((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (MACROBLOCK *)
                     CONCAT17(in_stack_ffffffffffffff6f,
                              CONCAT16(in_stack_ffffffffffffff6e,
                                       CONCAT15(in_stack_ffffffffffffff6d,in_stack_ffffffffffffff68)
                                      )),(int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                     (int)in_stack_ffffffffffffff60,
                     (BLOCK_SIZE)((uint)in_stack_ffffffffffffff5c >> 0x18),
                     (AQ_MODE)((uint)in_stack_ffffffffffffff5c >> 0x10),
                     (MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  bsize_00 = (BLOCK_SIZE)((uint)in_stack_ffffffffffffff5c >> 0x18);
  av1_set_error_per_bit((int *)(in_RDX + 0x15228),*(int *)(in_RDX + 0x4218));
  iVar6 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x3bf80));
  if (iVar6 == 0) {
    if (iVar4 != 0) {
      *(undefined4 *)(in_RDX + 0x15244) = 1;
    }
    av1_nonrd_pick_inter_mode_sb
              (in_stack_0000d030,in_stack_0000d028,in_stack_0000d020,in_stack_0000d018,
               in_stack_0000d017,in_stack_0000d008);
  }
  else {
    hybrid_intra_mode_search
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (MACROBLOCK *)
               CONCAT17(in_stack_ffffffffffffff6f,
                        CONCAT16(in_stack_ffffffffffffff6e,
                                 CONCAT15(in_stack_ffffffffffffff6d,in_stack_ffffffffffffff68))),
               in_stack_ffffffffffffff60,bsize_00,
               (PICK_MODE_CONTEXT *)
               CONCAT17(in_stack_ffffffffffffff57,
                        CONCAT43(in_stack_ffffffffffffff53,
                                 CONCAT12(in_stack_ffffffffffffff52,
                                          CONCAT11(in_stack_ffffffffffffff51,
                                                   in_stack_ffffffffffffff50)))));
  }
  if (*(int *)(lVar16 + 0x60d50) != 0) {
    bVar13 = 1;
    if (((iVar4 == 0) && (bVar13 = 0, 10 < *(int *)(lVar16 + 0x607a0))) &&
       (bVar13 = 0, *(int *)(lVar16 + 0x607b0) == 0)) {
      bVar12 = true;
      if (*(char *)(in_RDX + 0x25626) == '\0') {
        bVar12 = *(char *)(in_RDX + 0x25627) != '\0';
      }
      bVar13 = bVar12 ^ 0xff;
    }
    uVar5 = (uint)(bVar13 & 1);
    lVar11 = *(long *)(in_RDI + 0x3c1b8);
    iVar6 = get_mi_grid_idx((CommonModeInfoParams *)(in_RDI + 0x3c188),in_ECX - in_ECX % 0x10,
                            in_R8D - in_R8D % 0x10);
    plVar8 = (long *)(lVar11 + (long)iVar6 * 8);
    if (*(int *)(in_RDI + 0x3bfb8) < *(int *)(in_RDI + 0x3bfbc)) {
      uVar1 = *(undefined4 *)(in_RDI + 0x3bfb8);
      uVar10 = (undefined1)((uint)uVar1 >> 0x18);
    }
    else {
      uVar1 = *(undefined4 *)(in_RDI + 0x3bfbc);
      uVar10 = (undefined1)((uint)uVar1 >> 0x18);
    }
    bVar12 = false;
    if ((10 < *(int *)(lVar16 + 0x4272c)) && (bVar12 = false, CONCAT13(uVar10,(int3)uVar1) < 0x2d0))
    {
      bVar12 = *(int *)(lVar16 + 0x4269c) != 1;
    }
    uVar7 = 0xffffffff;
    if (bVar12) {
      uVar7 = 400;
    }
    if (*(int *)(lVar16 + 0x60d50) < 2) {
      bVar13 = 0;
      if (((char)((short)(*(short *)(*plVar8 + 0xa7) << 1) >> 0xc) != '\0') &&
         (bVar13 = 0, uVar5 != 0)) {
        bVar12 = false;
        if ((*(uint *)(in_RDX + 0x25640) < uVar7) && (bVar12 = true, 0xc < *(byte *)(lVar2 + 2))) {
          bVar12 = *(char *)(lVar2 + 2) == '\x10';
        }
        bVar13 = bVar12 ^ 0xff;
      }
      *(ushort *)(*plVar8 + 0xa7) =
           *(ushort *)(*plVar8 + 0xa7) & 0x87ff | (ushort)(bVar13 & 1) << 0xb;
    }
    else {
      bVar12 = false;
      if (((char)((short)(*(short *)(*plVar8 + 0xa7) << 1) >> 0xc) != '\0') &&
         (bVar12 = true, uVar5 == 0)) {
        bVar12 = *(int *)(in_RDX + 0x25640) == 0;
      }
      *(ushort *)(*plVar8 + 0xa7) = *(ushort *)(*plVar8 + 0xa7) & 0x87ff | (ushort)bVar12 << 0xb;
    }
    *(ushort *)(in_stack_00000010 + 0xa7) =
         *(ushort *)(in_stack_00000010 + 0xa7) & 0x87ff |
         ((short)(*(short *)(*plVar8 + 0xa7) << 1) >> 0xc & 0xfU) << 0xb;
  }
  *(undefined4 *)(in_RDX + 0x4218) = uVar14;
  *(undefined4 *)(in_stack_00000010 + 0x1a8) = *in_R9;
  *(undefined8 *)(in_stack_00000010 + 0x1b0) = *(undefined8 *)(in_R9 + 2);
  *(undefined8 *)(in_stack_00000010 + 0x1b8) = *(undefined8 *)(in_R9 + 4);
  return;
}

Assistant:

static void pick_sb_modes_nonrd(AV1_COMP *const cpi, TileDataEnc *tile_data,
                                MACROBLOCK *const x, int mi_row, int mi_col,
                                RD_STATS *rd_cost, BLOCK_SIZE bsize,
                                PICK_MODE_CONTEXT *ctx) {
  // For nonrd mode, av1_set_offsets is already called at the superblock level
  // in encode_nonrd_sb when we determine the partitioning.
  if (bsize != cpi->common.seq_params->sb_size ||
      cpi->sf.rt_sf.nonrd_check_partition_split == 1) {
    av1_set_offsets(cpi, &tile_data->tile_info, x, mi_row, mi_col, bsize);
  }
  assert(x->last_set_offsets_loc.mi_row == mi_row &&
         x->last_set_offsets_loc.mi_col == mi_col &&
         x->last_set_offsets_loc.bsize == bsize);
  AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  struct macroblock_plane *const p = x->plane;
  struct macroblockd_plane *const pd = xd->plane;
  const AQ_MODE aq_mode = cpi->oxcf.q_cfg.aq_mode;
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;
  int i;
  const int seg_skip =
      segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP);

  // This is only needed for real time/allintra row-mt enabled multi-threaded
  // encoding with cost update frequency set to COST_UPD_TILE/COST_UPD_OFF.
  wait_for_top_right_sb(&cpi->mt_info.enc_row_mt, &tile_data->row_mt_sync,
                        &tile_data->tile_info, cm->seq_params->sb_size,
                        cm->seq_params->mib_size_log2, bsize, mi_row, mi_col);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, pick_sb_modes_nonrd_time);
#endif
  // Sets up the tx_type_map buffer in MACROBLOCKD.
  xd->tx_type_map = txfm_info->tx_type_map_;
  xd->tx_type_map_stride = mi_size_wide[bsize];
  for (i = 0; i < num_planes; ++i) {
    p[i].coeff = ctx->coeff[i];
    p[i].qcoeff = ctx->qcoeff[i];
    p[i].dqcoeff = ctx->dqcoeff[i];
    p[i].eobs = ctx->eobs[i];
    p[i].txb_entropy_ctx = ctx->txb_entropy_ctx[i];
  }
  for (i = 0; i < 2; ++i) pd[i].color_index_map = ctx->color_index_map[i];

  if (!seg_skip) {
    x->force_zeromv_skip_for_blk =
        get_force_zeromv_skip_flag_for_blk(cpi, x, bsize);

    // Source variance may be already compute at superblock level, so no need
    // to recompute, unless bsize < sb_size or source_variance is not yet set.
    if (!x->force_zeromv_skip_for_blk &&
        (x->source_variance == UINT_MAX || bsize < cm->seq_params->sb_size))
      x->source_variance = av1_get_perpixel_variance_facade(
          cpi, xd, &x->plane[0].src, bsize, AOM_PLANE_Y);
  }

  // Save rdmult before it might be changed, so it can be restored later.
  const int orig_rdmult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, aq_mode, mbmi);
  // Set error per bit for current rdmult
  av1_set_error_per_bit(&x->errorperbit, x->rdmult);
  // Find best coding mode & reconstruct the MB so it is available
  // as a predictor for MBs that follow in the SB
  if (frame_is_intra_only(cm)) {
#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, hybrid_intra_mode_search_time);
#endif
    hybrid_intra_mode_search(cpi, x, rd_cost, bsize, ctx);
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, hybrid_intra_mode_search_time);
#endif
  } else {
#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, nonrd_pick_inter_mode_sb_time);
#endif
    if (seg_skip) {
      x->force_zeromv_skip_for_blk = 1;
      // TODO(marpan): Consider adding a function for nonrd:
      // av1_nonrd_pick_inter_mode_sb_seg_skip(), instead of setting
      // x->force_zeromv_skip flag and entering av1_nonrd_pick_inter_mode_sb().
    }
    av1_nonrd_pick_inter_mode_sb(cpi, tile_data, x, rd_cost, bsize, ctx);
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, nonrd_pick_inter_mode_sb_time);
#endif
  }
  if (cpi->sf.rt_sf.skip_cdef_sb) {
    // cdef_strength is initialized to 1 which means skip_cdef, and is updated
    // here. Check to see is skipping cdef is allowed. Never skip on slide/scene
    // change, near a key frame, or when color sensitivity is set. Always allow
    // cdef_skip for seg_skip = 1.
    const int allow_cdef_skipping =
        seg_skip ||
        (cpi->rc.frames_since_key > 10 && !cpi->rc.high_source_sad &&
         !(x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] ||
           x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)]));

    // Find the corresponding 64x64 block. It'll be the 128x128 block if that's
    // the block size.
    const int mi_row_sb = mi_row - mi_row % MI_SIZE_64X64;
    const int mi_col_sb = mi_col - mi_col % MI_SIZE_64X64;
    MB_MODE_INFO **mi_sb =
        cm->mi_params.mi_grid_base +
        get_mi_grid_idx(&cm->mi_params, mi_row_sb, mi_col_sb);
    const int is_720p_or_larger = AOMMIN(cm->width, cm->height) >= 720;
    unsigned int thresh_spatial_var =
        (cpi->oxcf.speed >= 11 && !is_720p_or_larger &&
         cpi->oxcf.tune_cfg.content != AOM_CONTENT_SCREEN)
            ? 400
            : UINT_MAX;
    // For skip_cdef_sb = 1: do not skip if allow_cdef_skipping is false or
    // intra or new mv is picked, with possible conidition on spatial variance.
    // For skip_cdef_sb >= 2: more aggressive mode to always skip unless
    // allow_cdef_skipping is false and source_variance is non-zero.
    if (cpi->sf.rt_sf.skip_cdef_sb >= 2) {
      mi_sb[0]->cdef_strength =
          mi_sb[0]->cdef_strength &&
          (allow_cdef_skipping || x->source_variance == 0);
    } else {
      mi_sb[0]->cdef_strength =
          mi_sb[0]->cdef_strength && allow_cdef_skipping &&
          !(x->source_variance < thresh_spatial_var &&
            (mbmi->mode < INTRA_MODES || mbmi->mode == NEWMV));
    }
    // Store in the pickmode context.
    ctx->mic.cdef_strength = mi_sb[0]->cdef_strength;
  }
  x->rdmult = orig_rdmult;
  ctx->rd_stats.rate = rd_cost->rate;
  ctx->rd_stats.dist = rd_cost->dist;
  ctx->rd_stats.rdcost = rd_cost->rdcost;
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, pick_sb_modes_nonrd_time);
#endif
}